

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceSpanTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  typed_option<bool> *this;
  undefined8 *in_RDX;
  ulong *in_RSI;
  search *in_RDI;
  action l_1;
  action l;
  option_group_definition new_options;
  bool search_span_bilou;
  task_data *D;
  typed_option<bool> *in_stack_fffffffffffffbd8;
  typed_option<bool> *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  allocator *paVar1;
  typed_option<unsigned_long> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  uint local_3c8;
  uint local_3bc;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [308];
  uint32_t in_stack_fffffffffffffdac;
  search *in_stack_fffffffffffffdb0;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [375];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [63];
  byte local_21;
  task_data *local_20;
  undefined8 *local_18;
  ulong *local_10;
  search *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (task_data *)operator_new(0x50);
  (local_20->only_two_allowed).erase_count = 0;
  local_20->multipass = 0;
  (local_20->only_two_allowed)._end = (uint *)0x0;
  (local_20->only_two_allowed).end_array = (uint *)0x0;
  (local_20->allowed_actions).erase_count = 0;
  (local_20->only_two_allowed)._begin = (uint *)0x0;
  (local_20->allowed_actions)._end = (uint *)0x0;
  (local_20->allowed_actions).end_array = (uint *)0x0;
  *(undefined8 *)local_20 = 0;
  (local_20->allowed_actions)._begin = (uint *)0x0;
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"search sequencespan options",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbe0,
             (string *)in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"search_span_bilou",&local_1f9);
  VW::config::make_option<bool>(in_stack_fffffffffffffbe8,(bool *)in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"switch to (internal) BILOU encoding instead of BIO encoding",&local_221);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8);
  VW::config::typed_option<bool>::typed_option(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"search_span_multipass",&local_389);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffbe8,(unsigned_long *)in_stack_fffffffffffffbe0);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
  paVar1 = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"do multiple passes",paVar1);
  this = (typed_option<bool> *)
         VW::config::typed_option<unsigned_long>::help
                   ((typed_option<unsigned_long> *)in_stack_fffffffffffffbe0,
                    (string *)in_stack_fffffffffffffbd8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)this,
             (typed_option<unsigned_long> *)in_stack_fffffffffffffbd8);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)this);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)this);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<bool>::~typed_option(this);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<bool>::~typed_option(this);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_18)(local_18,local_60);
  if ((local_21 & 1) == 0) {
    local_20->encoding = BIO;
  }
  else {
    in_stack_fffffffffffffbd8 =
         (typed_option<bool> *)
         std::operator<<((ostream *)&std::cerr,
                         "switching to BILOU encoding for sequence span labeling");
    std::ostream::operator<<(in_stack_fffffffffffffbd8,std::endl<char,std::char_traits<char>>);
    local_20->encoding = BILOU;
    *local_10 = *local_10 * 2 - 1;
  }
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)this);
  if (local_20->encoding == BIO) {
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
    for (local_3bc = 2; (ulong)local_3bc < *local_10; local_3bc = local_3bc + 2) {
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
    }
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
  }
  else if (local_20->encoding == BILOU) {
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
    for (local_3c8 = 2; (ulong)local_3c8 < *local_10; local_3c8 = local_3c8 + 4) {
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
    }
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffffbd8);
  }
  Search::search::set_task_data<SequenceSpanTask::task_data>(local_8,local_20);
  Search::search::set_options(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  Search::search::set_num_learners(local_8,local_20->multipass);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  bool search_span_bilou = false;
  option_group_definition new_options("search sequencespan options");
  new_options
      .add(make_option("search_span_bilou", search_span_bilou)
               .help("switch to (internal) BILOU encoding instead of BIO encoding"))
      .add(make_option("search_span_multipass", D->multipass).default_value(1).help("do multiple passes"));
  options.add_and_parse(new_options);

  if (search_span_bilou)
  {
    cerr << "switching to BILOU encoding for sequence span labeling" << endl;
    D->encoding = BILOU;
    num_actions = num_actions * 2 - 1;
  }
  else
    D->encoding = BIO;

  D->allowed_actions.clear();

  if (D->encoding == BIO)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 2) D->allowed_actions.push_back(l);
    D->allowed_actions.push_back(1);  // push back an extra 1 that we can overwrite later if we want
  }
  else if (D->encoding == BILOU)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 4)
    {
      D->allowed_actions.push_back(l);
      D->allowed_actions.push_back(l + 1);
    }
    D->only_two_allowed.push_back(0);
    D->only_two_allowed.push_back(0);
  }

  sch.set_task_data<task_data>(D);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      0);
  sch.set_num_learners(D->multipass);
}